

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind)

{
  bool local_9;
  TokenKind kind_local;
  
  if (((((kind == OpenParenthesisStar) || (kind == Comma)) || ((ushort)(kind - InOutKeyword) < 2))
      || ((kind == LocalKeyword || (kind == OutputKeyword)))) ||
     ((kind == PropertyKeyword || ((kind == RefKeyword || (kind == SequenceKeyword)))))) {
    local_9 = true;
  }
  else {
    local_9 = isPossibleDataType(kind);
  }
  return local_9;
}

Assistant:

bool SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesisStar:
        case TokenKind::LocalKeyword:
        case TokenKind::PropertyKeyword:
        case TokenKind::SequenceKeyword:
        case TokenKind::Comma:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}